

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzer::ProcessFcsField(HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *fcs)

{
  HdlcFcsType HVar1;
  U64 mEndingSampleInclusive;
  U64 mData1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  const_reference pvVar5;
  U64 mData2;
  U64 UVar6;
  element_type *peVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  undefined1 local_128 [8];
  Frame frame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  uchar *local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  const_iterator local_d8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  const_iterator local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  uchar *local_a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  const_iterator local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  const_iterator local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> readFcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> calculatedFcs;
  vector<HdlcByte,_std::allocator<HdlcByte>_> *fcs_local;
  HdlcAnalyzer *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  HdlcBytesToVectorBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,this,fcs)
  ;
  peVar3 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  HVar1 = peVar3->mHdlcFcs;
  if (HVar1 == HDLC_CRC8) {
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->mCurrentFrameBytes);
    if (!bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                (&this->mCurrentFrameBytes);
    }
    HdlcSimulationDataGenerator::Crc8(&local_70,&this->mCurrentFrameBytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  }
  else if (HVar1 == HDLC_CRC16) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->mCurrentFrameBytes);
    if (1 < sVar4) {
      pvVar8 = &this->mCurrentFrameBytes;
      local_88._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
      local_80 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator-(&local_88,2);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_78,&local_80);
      local_98._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_90,&local_98);
      local_a0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                    (pvVar8,local_78,local_90);
    }
    HdlcSimulationDataGenerator::Crc16(&local_b8,&this->mCurrentFrameBytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
  }
  else if (HVar1 == HDLC_CRC32) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->mCurrentFrameBytes);
    if (3 < sVar4) {
      pvVar8 = &this->mCurrentFrameBytes;
      local_d0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
      local_c8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator-(&local_d0,4);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_c0,&local_c8);
      local_e0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pvVar8);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_d8,&local_e0);
      local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                    (pvVar8,local_c0,local_d8);
    }
    HdlcSimulationDataGenerator::Crc32(&local_100,&this->mCurrentFrameBytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_100);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  }
  pvVar5 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::front(fcs);
  mEndingSampleInclusive = pvVar5->startSample;
  pvVar5 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::back(fcs);
  mData1 = pvVar5->endSample;
  mData2 = VectorToValue(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  UVar6 = VectorToValue(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &readFcs.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  CreateFrame((HdlcAnalyzer *)local_128,(U8)this,6,mEndingSampleInclusive,mData1,mData2,(U8)UVar6);
  std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  AddFrameToResults(this,(Frame *)local_128);
  peVar7 = std::auto_ptr<HdlcAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddMarker((ulonglong)peVar7,_frame,(Channel *)0x9);
  Frame::~Frame((Frame *)local_128);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &readFcs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void HdlcAnalyzer::ProcessFcsField( const vector<HdlcByte>& fcs )
{
    vector<U8> calculatedFcs;
    vector<U8> readFcs = HdlcBytesToVectorBytes( fcs );

    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
    {
        if( !mCurrentFrameBytes.empty() )
        {
            mCurrentFrameBytes.pop_back();
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc8( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC16:
    {
        if( mCurrentFrameBytes.size() >= 2 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 2, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc16( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC32:
    {
        if( mCurrentFrameBytes.size() >= 4 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 4, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc32( mCurrentFrameBytes );
        break;
    }
    }

    Frame frame = CreateFrame( HDLC_FIELD_FCS, fcs.front().startSample, fcs.back().endSample, VectorToValue( readFcs ),
                               VectorToValue( calculatedFcs ) );

    if( calculatedFcs != readFcs )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }

    AddFrameToResults( frame );

    // Put a marker in the end of the HDLC frame
    mResults->AddMarker( frame.mEndingSampleInclusive, AnalyzerResults::Stop, mSettings->mInputChannel );
}